

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PltFileManager.cpp
# Opt level: O0

void __thiscall pele::physics::pltfilemanager::PltFileManager::readPlotFile(PltFileManager *this)

{
  uint uVar1;
  MultiFab *pMVar2;
  BoxArray *pBVar3;
  DistributionMapping *pDVar4;
  BoxArray *in_RDI;
  int lev;
  BoxArray *in_stack_00000180;
  int in_stack_0000018c;
  PltFileManager *in_stack_00000190;
  int in_stack_000008b0;
  int in_stack_000008b4;
  char *in_stack_000008b8;
  string *in_stack_000008c0;
  FabArray<amrex::FArrayBox> *in_stack_000008c8;
  string *in_stack_fffffffffffffec8;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffee4;
  BoxArray *in_stack_fffffffffffffee8;
  allocator *in_stack_fffffffffffffef0;
  string *mfPrefix;
  string *levelPrefix;
  string *plotfilename;
  int level;
  allocator local_a1;
  string local_a0 [32];
  string local_80 [48];
  string local_50;
  undefined8 uStack_30;
  undefined8 local_28;
  int local_c;
  
  for (local_c = 0; local_c < (in_RDI->m_bat).m_op.m_bndryReg.m_doihi.vect[1]; local_c = local_c + 1
      ) {
    mfPrefix = (string *)
               &(in_RDI->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
    amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
              (in_stack_fffffffffffffed0,(size_type)in_stack_fffffffffffffec8);
    readLevelBoxArray(in_stack_00000190,in_stack_0000018c,in_stack_00000180);
    amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
              (in_stack_fffffffffffffed0,(size_type)in_stack_fffffffffffffec8);
    amrex::ParallelDescriptor::NProcs();
    amrex::DistributionMapping::DistributionMapping
              ((DistributionMapping *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
               in_stack_fffffffffffffee4);
    levelPrefix = (string *)((long)&in_RDI[1].m_bat.m_op + 0x2c);
    amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::
    operator[]((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               in_stack_fffffffffffffed0,(size_type)in_stack_fffffffffffffec8);
    amrex::DistributionMapping::operator=
              ((DistributionMapping *)in_stack_fffffffffffffed0,
               (DistributionMapping *)in_stack_fffffffffffffec8);
    amrex::DistributionMapping::~DistributionMapping((DistributionMapping *)0xe3e567);
    pMVar2 = amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                       ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                        in_stack_fffffffffffffed0,(size_type)in_stack_fffffffffffffec8);
    pBVar3 = amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                       (in_stack_fffffffffffffed0,(size_type)in_stack_fffffffffffffec8);
    pDVar4 = amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
             ::operator[]((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                           *)in_stack_fffffffffffffed0,(size_type)in_stack_fffffffffffffec8);
    uVar1 = (in_RDI->m_bat).m_op.m_bndryReg.m_loshft.vect[2];
    local_50.field_2._8_8_ = 0;
    uStack_30 = 0;
    local_50._M_string_length = 0;
    local_50.field_2._M_allocated_capacity = 0;
    local_28 = 0;
    amrex::MFInfo::MFInfo((MFInfo *)0xe3e5fc);
    local_50._M_dataplus = (_Alloc_hider)0x0;
    local_50._1_7_ = 0;
    in_stack_fffffffffffffec8 = &local_50;
    amrex::DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffffed0);
    plotfilename = in_stack_fffffffffffffec8;
    (*(pMVar2->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[2])
              (pMVar2,pBVar3,pDVar4,(ulong)uVar1,0,&local_50._M_string_length);
    level = (int)((ulong)pMVar2 >> 0x20);
    amrex::DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)0xe3e65b);
    amrex::MFInfo::~MFInfo((MFInfo *)0xe3e668);
    amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
              ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
               in_stack_fffffffffffffed0,(size_type)in_stack_fffffffffffffec8);
    in_stack_fffffffffffffef0 = &local_a1;
    in_stack_fffffffffffffee4 = local_c;
    in_stack_fffffffffffffee8 = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"Cell",in_stack_fffffffffffffef0);
    amrex::MultiFabFileFullPrefix(level,plotfilename,levelPrefix,mfPrefix);
    amrex::ParallelDescriptor::IOProcessorNumber();
    amrex::VisMF::Read(in_stack_000008c8,in_stack_000008c0,in_stack_000008b8,in_stack_000008b4,
                       in_stack_000008b0);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  }
  return;
}

Assistant:

void
PltFileManager::readPlotFile()
{
  // Set BoxArray, DistMap on each level and load data
  // TODO: only load a subset of the pltfile variables
  for (int lev = 0; lev < m_nlevels; ++lev) {
    readLevelBoxArray(lev, m_grids[lev]);
    m_dmaps[lev] = DistributionMapping(m_grids[lev]);
    m_data[lev].define(m_grids[lev], m_dmaps[lev], m_nvars, 0);
    VisMF::Read(
      m_data[lev],
      MultiFabFileFullPrefix(lev, m_pltFile, level_prefix, "Cell"));
  }
}